

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<NULLC::Range,_false,_false>::grow_and_add
          (FastVector<NULLC::Range,_false,_false> *this,uint newSize,Range *val)

{
  Range *pRVar1;
  uint uVar2;
  Range *pRVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  pRVar3 = this->data;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  uVar4 = *(undefined4 *)((long)&val->start + 4);
  uVar5 = *(undefined4 *)&val->end;
  uVar6 = *(undefined4 *)((long)&val->end + 4);
  pRVar1 = this->data + uVar2;
  *(undefined4 *)&pRVar1->start = *(undefined4 *)&val->start;
  *(undefined4 *)((long)&pRVar1->start + 4) = uVar4;
  *(undefined4 *)&pRVar1->end = uVar5;
  *(undefined4 *)((long)&pRVar1->end + 4) = uVar6;
  if (pRVar3 != (Range *)0x0) {
    (*(code *)NULLC::dealloc)(pRVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}